

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DPlaneWatcher::Tick(DPlaneWatcher *this)

{
  double dVar1;
  int num;
  sector_t *psVar2;
  line_t *line;
  secplane_t *psVar3;
  AActor *activator;
  
  psVar2 = this->Sector;
  if (psVar2 == (sector_t *)0x0) goto LAB_00500e45;
  psVar3 = &psVar2->ceilingplane;
  if (this->bCeiling == false) {
    psVar3 = &psVar2->floorplane;
  }
  dVar1 = this->WatchD;
  if (((dVar1 <= this->LastD) || (psVar3->D < dVar1)) &&
     ((this->LastD <= dVar1 || (dVar1 < psVar3->D)))) {
    return;
  }
  num = this->Special;
  line = this->Line;
  activator = (this->Activator).field_0.p;
  if (activator == (AActor *)0x0) {
LAB_00500e1a:
    activator = (AActor *)0x0;
  }
  else if (((activator->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->Activator).field_0.p = (AActor *)0x0;
    goto LAB_00500e1a;
  }
  P_ExecuteSpecial(num,line,activator,this->LineSide,this->Arg0,this->Arg1,this->Arg2,this->Arg3,
                   this->Arg4);
LAB_00500e45:
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void DPlaneWatcher::Tick ()
{
	if (Sector == NULL)
	{
		Destroy ();
		return;
	}

	double newd;

	if (bCeiling)
	{
		newd = Sector->ceilingplane.fD();
	}
	else
	{
		newd = Sector->floorplane.fD();
	}

	if ((LastD < WatchD && newd >= WatchD) ||
		(LastD > WatchD && newd <= WatchD))
	{
		P_ExecuteSpecial(Special, Line, Activator, LineSide, Arg0, Arg1, Arg2, Arg3, Arg4);
		Destroy ();
	}

}